

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleFileMuxer.cpp
# Opt level: O0

bool __thiscall SingleFileMuxer::doFlush(SingleFileMuxer *this)

{
  type dstFile;
  bool bVar1;
  reference __in;
  type *ppSVar2;
  uint8_t *__dest;
  uint uVar3;
  uint len;
  uint8_t *newBuff;
  int roundBufLen;
  int lastBlockSize;
  StreamInfo *streamInfo;
  type *snd;
  type *fst;
  _Self local_28;
  iterator __end1;
  iterator __begin1;
  map<int,_SingleFileMuxer::StreamInfo_*,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
  *__range1;
  SingleFileMuxer *this_local;
  
  __end1 = std::
           map<int,_SingleFileMuxer::StreamInfo_*,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
           ::begin(&this->m_streamInfo);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_SingleFileMuxer::StreamInfo_*,_std::less<int>,_std::allocator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>_>
       ::end(&this->m_streamInfo);
  while (bVar1 = std::operator!=(&__end1,&local_28), bVar1) {
    __in = std::_Rb_tree_iterator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>::operator*
                     (&__end1);
    std::get<0ul,int_const,SingleFileMuxer::StreamInfo*>(__in);
    ppSVar2 = std::get<1ul,int_const,SingleFileMuxer::StreamInfo*>(__in);
    dstFile = *ppSVar2;
    uVar3 = dstFile->m_bufLen & 0xffff;
    len = dstFile->m_bufLen & 0x7fff0000;
    bVar1 = MuxerManager::isAsyncMode((this->super_AbstractMuxer).m_owner);
    if (bVar1) {
      if (uVar3 == 0) {
        MuxerManager::asyncWriteBuffer
                  ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,dstFile->m_buffer,
                   len,(AbstractOutputStream *)dstFile);
        dstFile->m_buffer = (uint8_t *)0x0;
      }
      else {
        __dest = (uint8_t *)operator_new__((long)(int)uVar3);
        memcpy(__dest,dstFile->m_buffer + (int)len,(long)(int)uVar3);
        MuxerManager::asyncWriteBuffer
                  ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,dstFile->m_buffer,
                   len,(AbstractOutputStream *)dstFile);
        dstFile->m_buffer = __dest;
      }
    }
    else {
      MuxerManager::syncWriteBuffer
                ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,dstFile->m_buffer,
                 len,(AbstractOutputStream *)dstFile);
      memmove(dstFile->m_buffer,dstFile->m_buffer + (int)len,(long)(int)uVar3);
    }
    dstFile->m_bufLen = uVar3;
    std::_Rb_tree_iterator<std::pair<const_int,_SingleFileMuxer::StreamInfo_*>_>::operator++
              (&__end1);
  }
  return true;
}

Assistant:

bool SingleFileMuxer::doFlush()
{
    for (const auto& [fst, snd] : m_streamInfo)
    {
        StreamInfo* streamInfo = snd;
        const int lastBlockSize = streamInfo->m_bufLen & 0xffff;  // last 64K of data
        const int roundBufLen = streamInfo->m_bufLen & 0x7fff0000;
        if (m_owner->isAsyncMode())
        {
            if (lastBlockSize > 0)
            {
                const auto newBuff = new uint8_t[lastBlockSize];
                memcpy(newBuff, streamInfo->m_buffer + roundBufLen, lastBlockSize);
                m_owner->asyncWriteBuffer(this, streamInfo->m_buffer, roundBufLen, &streamInfo->m_file);
                streamInfo->m_buffer = newBuff;
            }
            else
            {
                m_owner->asyncWriteBuffer(this, streamInfo->m_buffer, roundBufLen, &streamInfo->m_file);
                streamInfo->m_buffer = nullptr;
            }
        }
        else
        {
            m_owner->syncWriteBuffer(this, streamInfo->m_buffer, roundBufLen, &streamInfo->m_file);
            memmove(streamInfo->m_buffer, streamInfo->m_buffer + roundBufLen, lastBlockSize);
        }
        streamInfo->m_bufLen = lastBlockSize;
    }
    return true;
}